

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldBase::MapBegin(MapFieldBase *this,MapIterator *map_iter)

{
  UntypedMapBase *this_00;
  UntypedMapIterator local_30;
  
  this_00 = (*((this->super_MapFieldBaseForParse).vtable_)->get_map)
                      (&this->super_MapFieldBaseForParse,false);
  UntypedMapBase::begin(&local_30,this_00);
  (map_iter->iter_).bucket_index_ = local_30.bucket_index_;
  *(undefined4 *)&(map_iter->iter_).field_0x14 = local_30._20_4_;
  (map_iter->iter_).node_ = local_30.node_;
  (map_iter->iter_).m_ = local_30.m_;
  (*(this->super_MapFieldBaseForParse).vtable_[3].get_map)
            ((MapFieldBaseForParse *)map_iter,SUB81(this_00,0));
  return;
}

Assistant:

void MapFieldBase::MapBegin(MapIterator* map_iter) const {
  map_iter->iter_ = GetMap().begin();
  SetMapIteratorValue(map_iter);
}